

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O0

void __thiscall
LocalGraphTest_ObstacleUnreachable_Test::LocalGraphTest_ObstacleUnreachable_Test
          (LocalGraphTest_ObstacleUnreachable_Test *this)

{
  LocalGraphTest_ObstacleUnreachable_Test *this_local;
  
  testing::Test::Test(&this->super_LocalGraphTest);
  (this->super_LocalGraphTest)._vptr_Test =
       (_func_int **)&PTR__LocalGraphTest_ObstacleUnreachable_Test_00571cf0;
  return;
}

Assistant:

TEST_F(LocalGraphTest, ObstacleUnreachable) {
  auto moduleText = R"wasm(
    (module
      (func $foo (result i32)
        ;; An unreachable between the set and get.
        (local $x i32)
        (local.set $x
          (i32.const 10)
        )
        (nop)
        (unreachable)
        (nop)
        (local.get $x)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* set = block->list[0]->cast<LocalSet>();
  auto* nopA = block->list[1]->cast<Nop>();
  auto* nopB = block->list[3]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // The get is unreachable, and the set has no gets.
  EXPECT_EQ(graph.getSetInfluences(set).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopA).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopB).size(), 0U);
}